

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

int __thiscall tetgenmesh::checkseg4encroach(tetgenmesh *this,point pa,point pb,point checkpt)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double prjpt [3];
  
  if ((pb[2] - checkpt[2]) * (pa[2] - checkpt[2]) +
      (pb[1] - checkpt[1]) * (pa[1] - checkpt[1]) + (*pb - *checkpt) * (*pa - *checkpt) < 0.0) {
    if (this->b->metric == 0) {
      return 1;
    }
    if (pa[this->pointmtrindex] <= 0.0) {
      return 1;
    }
    if (pb[this->pointmtrindex] <= 0.0) {
      return 1;
    }
    projpt2edge(this,checkpt,pa,pb,prjpt);
    dVar3 = distance(this,pa,pb);
    dVar4 = distance(this,pa,prjpt);
    dVar1 = pa[this->pointmtrindex];
    dVar2 = pb[this->pointmtrindex];
    dVar5 = distance(this,checkpt,prjpt);
    if (dVar5 < (dVar2 - dVar1) * (dVar4 / dVar3) + dVar1) {
      return 1;
    }
  }
  return 0;
}

Assistant:

int tetgenmesh::checkseg4encroach(point pa, point pb, point checkpt)
{
  // Check if the point lies inside the diametrical sphere of this seg. 
  REAL v1[3], v2[3];

  v1[0] = pa[0] - checkpt[0];
  v1[1] = pa[1] - checkpt[1];
  v1[2] = pa[2] - checkpt[2];
  v2[0] = pb[0] - checkpt[0];
  v2[1] = pb[1] - checkpt[1];
  v2[2] = pb[2] - checkpt[2];

  if (dot(v1, v2) < 0) {
    // Inside.
    if (b->metric) { // -m option.
      if ((pa[pointmtrindex] > 0) && (pb[pointmtrindex] > 0)) {
        // The projection of 'checkpt' lies inside the segment [a,b].
        REAL prjpt[3], u, v, t;
        projpt2edge(checkpt, pa, pb, prjpt);
        // Interoplate the mesh size at the location 'prjpt'.
        u = distance(pa, pb);
        v = distance(pa, prjpt);
        t = v / u;
        // 'u' is the mesh size at 'prjpt'
        u = pa[pointmtrindex] + t * (pb[pointmtrindex] - pa[pointmtrindex]);
        v = distance(checkpt, prjpt);
        if (v < u) {
          return 1; // Encroached prot-ball!
        }
      } else {
        return 1; // NO protecting ball. Encroached.
      }
    } else {
      return 1; // Inside! Encroached.
    }
  }

  return 0;
}